

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserErrors xmlIOErr(int err)

{
  xmlParserErrors local_10;
  xmlParserErrors code;
  int err_local;
  
  switch(err) {
  case 1:
    local_10 = XML_IO_EPERM;
    break;
  case 2:
    local_10 = XML_IO_ENOENT;
    break;
  case 3:
    local_10 = XML_IO_ESRCH;
    break;
  case 4:
    local_10 = XML_IO_EINTR;
    break;
  case 5:
    local_10 = XML_IO_EIO;
    break;
  case 6:
    local_10 = XML_IO_ENXIO;
    break;
  default:
    local_10 = XML_IO_UNKNOWN;
    break;
  case 8:
    local_10 = XML_IO_ENOEXEC;
    break;
  case 9:
    local_10 = XML_IO_EBADF;
    break;
  case 10:
    local_10 = XML_IO_ECHILD;
    break;
  case 0xb:
    local_10 = XML_IO_EAGAIN;
    break;
  case 0xc:
    local_10 = XML_IO_ENOMEM;
    break;
  case 0xd:
    local_10 = XML_IO_EACCES;
    break;
  case 0xe:
    local_10 = XML_IO_EFAULT;
    break;
  case 0x10:
    local_10 = XML_IO_EBUSY;
    break;
  case 0x11:
    local_10 = XML_IO_EEXIST;
    break;
  case 0x12:
    local_10 = XML_IO_EXDEV;
    break;
  case 0x13:
    local_10 = XML_IO_ENODEV;
    break;
  case 0x14:
    local_10 = XML_IO_ENOTDIR;
    break;
  case 0x15:
    local_10 = XML_IO_EISDIR;
    break;
  case 0x16:
    local_10 = XML_IO_EINVAL;
    break;
  case 0x17:
    local_10 = XML_IO_ENFILE;
    break;
  case 0x18:
    local_10 = XML_IO_EMFILE;
    break;
  case 0x19:
    local_10 = XML_IO_ENOTTY;
    break;
  case 0x1b:
    local_10 = XML_IO_EFBIG;
    break;
  case 0x1c:
    local_10 = XML_IO_ENOSPC;
    break;
  case 0x1d:
    local_10 = XML_IO_ESPIPE;
    break;
  case 0x1e:
    local_10 = XML_IO_EROFS;
    break;
  case 0x1f:
    local_10 = XML_IO_EMLINK;
    break;
  case 0x20:
    local_10 = XML_IO_EPIPE;
    break;
  case 0x21:
    local_10 = XML_IO_EDOM;
    break;
  case 0x22:
    local_10 = XML_IO_ERANGE;
    break;
  case 0x23:
    local_10 = XML_IO_EDEADLK;
    break;
  case 0x24:
    local_10 = XML_IO_ENAMETOOLONG;
    break;
  case 0x25:
    local_10 = XML_IO_ENOLCK;
    break;
  case 0x26:
    local_10 = XML_IO_ENOSYS;
    break;
  case 0x27:
    local_10 = XML_IO_ENOTEMPTY;
    break;
  case 0x4a:
    local_10 = XML_IO_EBADMSG;
    break;
  case 0x58:
    local_10 = XML_IO_ENOTSOCK;
    break;
  case 0x5a:
    local_10 = XML_IO_EMSGSIZE;
    break;
  case 0x5f:
    local_10 = XML_IO_ENOTSUP;
    break;
  case 0x61:
    local_10 = XML_IO_EAFNOSUPPORT;
    break;
  case 0x62:
    local_10 = XML_IO_EADDRINUSE;
    break;
  case 0x65:
    local_10 = XML_IO_ENETUNREACH;
    break;
  case 0x6a:
    local_10 = XML_IO_EISCONN;
    break;
  case 0x6e:
    local_10 = XML_IO_ETIMEDOUT;
    break;
  case 0x6f:
    local_10 = XML_IO_ECONNREFUSED;
    break;
  case 0x72:
    local_10 = XML_IO_EALREADY;
    break;
  case 0x73:
    local_10 = XML_IO_EINPROGRESS;
    break;
  case 0x7d:
    local_10 = XML_IO_ECANCELED;
  }
  return local_10;
}

Assistant:

static xmlParserErrors
xmlIOErr(int err)
{
    xmlParserErrors code;

    switch (err) {
#ifdef EACCES
        case EACCES: code = XML_IO_EACCES; break;
#endif
#ifdef EAGAIN
        case EAGAIN: code = XML_IO_EAGAIN; break;
#endif
#ifdef EBADF
        case EBADF: code = XML_IO_EBADF; break;
#endif
#ifdef EBADMSG
        case EBADMSG: code = XML_IO_EBADMSG; break;
#endif
#ifdef EBUSY
        case EBUSY: code = XML_IO_EBUSY; break;
#endif
#ifdef ECANCELED
        case ECANCELED: code = XML_IO_ECANCELED; break;
#endif
#ifdef ECHILD
        case ECHILD: code = XML_IO_ECHILD; break;
#endif
#ifdef EDEADLK
        case EDEADLK: code = XML_IO_EDEADLK; break;
#endif
#ifdef EDOM
        case EDOM: code = XML_IO_EDOM; break;
#endif
#ifdef EEXIST
        case EEXIST: code = XML_IO_EEXIST; break;
#endif
#ifdef EFAULT
        case EFAULT: code = XML_IO_EFAULT; break;
#endif
#ifdef EFBIG
        case EFBIG: code = XML_IO_EFBIG; break;
#endif
#ifdef EINPROGRESS
        case EINPROGRESS: code = XML_IO_EINPROGRESS; break;
#endif
#ifdef EINTR
        case EINTR: code = XML_IO_EINTR; break;
#endif
#ifdef EINVAL
        case EINVAL: code = XML_IO_EINVAL; break;
#endif
#ifdef EIO
        case EIO: code = XML_IO_EIO; break;
#endif
#ifdef EISDIR
        case EISDIR: code = XML_IO_EISDIR; break;
#endif
#ifdef EMFILE
        case EMFILE: code = XML_IO_EMFILE; break;
#endif
#ifdef EMLINK
        case EMLINK: code = XML_IO_EMLINK; break;
#endif
#ifdef EMSGSIZE
        case EMSGSIZE: code = XML_IO_EMSGSIZE; break;
#endif
#ifdef ENAMETOOLONG
        case ENAMETOOLONG: code = XML_IO_ENAMETOOLONG; break;
#endif
#ifdef ENFILE
        case ENFILE: code = XML_IO_ENFILE; break;
#endif
#ifdef ENODEV
        case ENODEV: code = XML_IO_ENODEV; break;
#endif
#ifdef ENOENT
        case ENOENT: code = XML_IO_ENOENT; break;
#endif
#ifdef ENOEXEC
        case ENOEXEC: code = XML_IO_ENOEXEC; break;
#endif
#ifdef ENOLCK
        case ENOLCK: code = XML_IO_ENOLCK; break;
#endif
#ifdef ENOMEM
        case ENOMEM: code = XML_IO_ENOMEM; break;
#endif
#ifdef ENOSPC
        case ENOSPC: code = XML_IO_ENOSPC; break;
#endif
#ifdef ENOSYS
        case ENOSYS: code = XML_IO_ENOSYS; break;
#endif
#ifdef ENOTDIR
        case ENOTDIR: code = XML_IO_ENOTDIR; break;
#endif
#ifdef ENOTEMPTY
        case ENOTEMPTY: code = XML_IO_ENOTEMPTY; break;
#endif
#ifdef ENOTSUP
        case ENOTSUP: code = XML_IO_ENOTSUP; break;
#endif
#ifdef ENOTTY
        case ENOTTY: code = XML_IO_ENOTTY; break;
#endif
#ifdef ENXIO
        case ENXIO: code = XML_IO_ENXIO; break;
#endif
#ifdef EPERM
        case EPERM: code = XML_IO_EPERM; break;
#endif
#ifdef EPIPE
        case EPIPE: code = XML_IO_EPIPE; break;
#endif
#ifdef ERANGE
        case ERANGE: code = XML_IO_ERANGE; break;
#endif
#ifdef EROFS
        case EROFS: code = XML_IO_EROFS; break;
#endif
#ifdef ESPIPE
        case ESPIPE: code = XML_IO_ESPIPE; break;
#endif
#ifdef ESRCH
        case ESRCH: code = XML_IO_ESRCH; break;
#endif
#ifdef ETIMEDOUT
        case ETIMEDOUT: code = XML_IO_ETIMEDOUT; break;
#endif
#ifdef EXDEV
        case EXDEV: code = XML_IO_EXDEV; break;
#endif
#ifdef ENOTSOCK
        case ENOTSOCK: code = XML_IO_ENOTSOCK; break;
#endif
#ifdef EISCONN
        case EISCONN: code = XML_IO_EISCONN; break;
#endif
#ifdef ECONNREFUSED
        case ECONNREFUSED: code = XML_IO_ECONNREFUSED; break;
#endif
#ifdef ENETUNREACH
        case ENETUNREACH: code = XML_IO_ENETUNREACH; break;
#endif
#ifdef EADDRINUSE
        case EADDRINUSE: code = XML_IO_EADDRINUSE; break;
#endif
#ifdef EALREADY
        case EALREADY: code = XML_IO_EALREADY; break;
#endif
#ifdef EAFNOSUPPORT
        case EAFNOSUPPORT: code = XML_IO_EAFNOSUPPORT; break;
#endif
        default: code = XML_IO_UNKNOWN; break;
    }

    return(code);
}